

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Scan_add(int g_a,int g_b,int g_sbit,int lo,int hi,int excl)

{
  Integer ahi;
  Integer alo;
  Integer x;
  Integer s;
  Integer b;
  Integer a;
  Integer in_stack_00001388;
  Integer in_stack_00001390;
  Integer in_stack_00001398;
  Integer in_stack_000013a0;
  Integer in_stack_000013a8;
  Integer in_stack_000013b0;
  
  pnga_scan_add(in_stack_000013b0,in_stack_000013a8,in_stack_000013a0,in_stack_00001398,
                in_stack_00001390,in_stack_00001388);
  return;
}

Assistant:

void GA_Scan_add(int g_a, int g_b, int g_sbit, int lo,
                 int hi, int excl)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer x = (Integer)excl;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_add(a, b, s, alo, ahi, x);

}